

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

kp_error_t kp_cfg_find(kp_ctx *ctx,char *path,char *cfg_path,size_t size)

{
  long lVar1;
  int iVar2;
  kp_error_t kVar3;
  ulong uVar4;
  char *pcVar5;
  int *piVar6;
  long in_FS_OFFSET;
  stat stats;
  char abspath [4096];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = strlcat(cfg_path,path,size);
  if (uVar4 < size) {
    do {
      pcVar5 = strrchr(cfg_path,0x2f);
      if (pcVar5 == (char *)0x0 && cfg_path == (char *)0x0) {
        piVar6 = __errno_location();
        *piVar6 = 2;
        break;
      }
      if (pcVar5 == (char *)0x0) {
        pcVar5 = cfg_path;
      }
      memset(abspath,0,0x1000);
      *pcVar5 = '\0';
      iVar2 = __snprintf_chk(abspath,0x1000,1,0x1000,"%s/%s/.config",ctx->ws_path,cfg_path);
      if (0xfff < iVar2) goto LAB_00103b63;
      iVar2 = stat(abspath,(stat *)&stats);
      if (-1 < iVar2) {
        kVar3 = 0;
        goto LAB_00103b71;
      }
      piVar6 = __errno_location();
    } while (*piVar6 == 2);
  }
  else {
LAB_00103b63:
    piVar6 = __errno_location();
    *piVar6 = 0x24;
  }
  kVar3 = 5;
LAB_00103b71:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return kVar3;
}

Assistant:

kp_error_t
kp_cfg_find(struct kp_ctx *ctx, const char *path, char *cfg_path, size_t size)
{
	char *dir = NULL;
	struct stat stats;

	if (strlcat(cfg_path, path, size) >= size) {
		errno = ENAMETOOLONG;
		return KP_ERRNO;
	}

	while ((dir = strrchr(cfg_path, '/')) != NULL
	       || ((dir != cfg_path) && (dir = cfg_path))) {
		char abspath[PATH_MAX] = "";

		dir[0] = '\0';

		if (snprintf(abspath, PATH_MAX, "%s/%s/" KP_CONFIG_SAFE_NAME,
                    ctx->ws_path, cfg_path) >= PATH_MAX) {
			errno = ENAMETOOLONG;
			return KP_ERRNO;
		}

		if (stat(abspath, &stats) < 0) {
			if (errno == ENOENT) {
				continue;
			}
			return KP_ERRNO;
		} else {
			break;
		}
	}

	if (dir == NULL) {
		errno = ENOENT;
		return KP_ERRNO;
	}

	return KP_SUCCESS;
}